

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yyjson.cpp
# Opt level: O3

void duckdb_yyjson::yyjson_mut_stat(yyjson_mut_val *val,usize *val_sum,usize *str_sum)

{
  usize uVar1;
  ulong uVar2;
  byte bVar3;
  byte bVar4;
  long lVar5;
  yyjson_mut_val *val_00;
  
  bVar3 = (byte)val->tag;
  uVar1 = *val_sum;
  *val_sum = uVar1 + 1;
  bVar4 = ~bVar3;
  if ((bVar4 & 6) == 0) {
    uVar2 = val->tag;
    lVar5 = (uVar2 >> 8) << ((bVar4 & 7) == 0);
    val_00 = (yyjson_mut_val *)(val->uni).str;
    *val_sum = uVar1 + 1 + lVar5;
    if (0xff < uVar2) {
      lVar5 = lVar5 + (ulong)(lVar5 == 0);
      do {
        bVar3 = (byte)val_00->tag;
        if ((bVar3 & 3) == 1) {
          *str_sum = (val_00->tag >> 8) + *str_sum + 1;
        }
        else if ((~bVar3 & 6) == 0) {
          yyjson_mut_stat(val_00,val_sum,str_sum);
          *val_sum = *val_sum - 1;
        }
        val_00 = val_00->next;
        lVar5 = lVar5 + -1;
      } while (lVar5 != 0);
    }
  }
  else if ((bVar3 & 3) == 1) {
    *str_sum = (val->tag >> 8) + *str_sum + 1;
  }
  return;
}

Assistant:

static void yyjson_mut_stat(yyjson_mut_val *val,
                            usize *val_sum, usize *str_sum) {
    yyjson_type type = unsafe_yyjson_get_type(val);
    *val_sum += 1;
    if (type == YYJSON_TYPE_ARR || type == YYJSON_TYPE_OBJ) {
        yyjson_mut_val *child = (yyjson_mut_val *)val->uni.ptr;
        usize len = unsafe_yyjson_get_len(val), i;
        len <<= (u8)(type == YYJSON_TYPE_OBJ);
        *val_sum += len;
        for (i = 0; i < len; i++) {
            yyjson_type stype = unsafe_yyjson_get_type(child);
            if (stype == YYJSON_TYPE_STR || stype == YYJSON_TYPE_RAW) {
                *str_sum += unsafe_yyjson_get_len(child) + 1;
            } else if (stype == YYJSON_TYPE_ARR || stype == YYJSON_TYPE_OBJ) {
                yyjson_mut_stat(child, val_sum, str_sum);
                *val_sum -= 1;
            }
            child = child->next;
        }
    } else if (type == YYJSON_TYPE_STR || type == YYJSON_TYPE_RAW) {
        *str_sum += unsafe_yyjson_get_len(val) + 1;
    }
}